

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Obj_t * Aig_ManDupRepres_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  
  if ((Aig_Obj_t *)(pObj->field_5).pData != (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t *)(pObj->field_5).pData;
  }
  if ((p->pReprs == (Aig_Obj_t **)0x0) || (pAVar1 = p->pReprs[pObj->Id], pAVar1 == (Aig_Obj_t *)0x0)
     ) {
    Aig_ManDupRepres_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Aig_ManDupRepres_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    pAVar1 = Aig_ObjChild0Repres(p,pObj);
    p1 = Aig_ObjChild1Repres(p,pObj);
    pAVar1 = Aig_And(pNew,pAVar1,p1);
  }
  else {
    Aig_ManDupRepres_rec(pNew,p,pAVar1);
    pAVar1 = (Aig_Obj_t *)
             ((ulong)((*(uint *)&pObj->field_0x18 ^ *(uint *)&pAVar1->field_0x18) >> 3 & 1) ^
             (ulong)(pAVar1->field_5).pData);
  }
  (pObj->field_5).pData = pAVar1;
  return pAVar1;
}

Assistant:

Aig_Obj_t * Aig_ManDupRepres_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pRepr;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( (pRepr = Aig_ObjRepr(p, pObj)) )
    {
        Aig_ManDupRepres_rec( pNew, p, pRepr );
        return (Aig_Obj_t *)(pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pRepr->fPhase ^ pObj->fPhase ));
    }
    Aig_ManDupRepres_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Aig_ManDupRepres_rec( pNew, p, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Repres(p, pObj), Aig_ObjChild1Repres(p, pObj) ));
}